

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<char[13],std::__cxx11::string,std::__cxx11::string>
               (ostream *out,char *fmt,char (*args) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff58;
  char local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<char[13],std::__cxx11::string,std::__cxx11::string>
            ((char (*) [13])local_60,in_RSI,in_RDI);
  vformat((ostream *)in_RSI,(char *)in_RDI,in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}